

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

mqtt_queued_message *
mqtt_mq_find(mqtt_message_queue *mq,MQTTControlPacketType control_type,uint16_t *packet_id)

{
  mqtt_queued_message *pmVar1;
  mqtt_queued_message *pmVar2;
  mqtt_queued_message *pmVar3;
  
  pmVar3 = (mqtt_queued_message *)mq->mem_end;
  pmVar2 = pmVar3;
  do {
    while( true ) {
      do {
        pmVar1 = pmVar2;
        pmVar2 = pmVar1 + -1;
        if (pmVar2 < mq->queue_tail) {
          return (mqtt_queued_message *)0x0;
        }
        pmVar3 = pmVar3 + -1;
      } while (pmVar1[-1].control_type != control_type);
      if (packet_id != (uint16_t *)0x0) break;
      if (pmVar1[-1].state != MQTT_QUEUED_COMPLETE) {
        return pmVar3;
      }
    }
  } while (*packet_id != pmVar1[-1].packet_id);
  return pmVar2;
}

Assistant:

struct mqtt_queued_message* mqtt_mq_find(const struct mqtt_message_queue *mq, enum MQTTControlPacketType control_type, const uint16_t *packet_id)
{
    struct mqtt_queued_message *curr;
    for(curr = mqtt_mq_get(mq, 0); curr >= mq->queue_tail; --curr) {
        if (curr->control_type == control_type) {
            if ((packet_id == NULL && curr->state != MQTT_QUEUED_COMPLETE) ||
                (packet_id != NULL && *packet_id == curr->packet_id)) {
                return curr;
            }
        }
    }
    return NULL;
}